

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Unload(Map *this)

{
  pointer ppNVar1;
  Arena *pAVar2;
  pointer ppAVar3;
  pointer pMVar4;
  _List_iterator<NPC_*> __first;
  _List_node_base *p_Var5;
  pointer ppAVar6;
  pointer ppNVar7;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *plVar8;
  _List_iterator<NPC_*> __last;
  NPC *npc;
  
  this->exists = false;
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar7 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar7 != ppNVar1; ppNVar7 = ppNVar7 + 1) {
    npc = *ppNVar7;
    plVar8 = &npc->damagelist;
    p_Var5 = (_List_node_base *)plVar8;
    while (p_Var5 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)plVar8) {
      __last._M_node = (_List_node_base *)(*(long *)p_Var5[1]._M_next + 0x378);
      __first = std::
                __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                          (*(_List_node_base **)(*(long *)p_Var5[1]._M_next + 0x378),__last,
                           (_Iter_equals_val<NPC_*const>)&npc);
      std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                 (const_iterator)__first._M_node,
                 (_List_node_base *)(*(long *)p_Var5[1]._M_next + 0x378));
    }
  }
  ppNVar7 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data
      ._M_finish != ppNVar7) {
    (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = ppNVar7;
  }
  pAVar2 = this->arena;
  if (pAVar2 != (Arena *)0x0) {
    ppAVar3 = (pAVar2->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppAVar6 = (pAVar2->spawns).
                   super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppAVar6 != ppAVar3; ppAVar6 = ppAVar6 + 1) {
      operator_delete(*ppAVar6,4);
    }
    pAVar2 = this->arena;
    if (pAVar2 != (Arena *)0x0) {
      Arena::~Arena(pAVar2);
    }
    operator_delete(pAVar2,0x38);
  }
  this->arena = (Arena *)0x0;
  std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::clear
            (&this->chests);
  pMVar4 = (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar4;
  }
  return;
}

Assistant:

void Map::Unload()
{
	this->exists = false;

	UTIL_FOREACH(this->npcs, npc)
	{
		UTIL_FOREACH_CREF(npc->damagelist, opponent)
		{
			opponent->attacker->unregister_npc.erase(
				std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), npc),
				opponent->attacker->unregister_npc.end()
			);
		}
	}

	this->npcs.clear();

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->spawns, spawn)
			delete spawn;

		delete this->arena;
	}

	this->arena = nullptr;

	this->chests.clear();
	this->tiles.clear();
}